

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConn.cpp
# Opt level: O2

StatusCode __thiscall HttpConn::parseRequesetLine(HttpConn *this,int end_idx)

{
  pointer pcVar1;
  Method MVar2;
  size_type *psVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  StatusCode SVar7;
  size_type *local_48;
  string requestLine;
  
  pcVar1 = (this->readBuff_).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_48 = &requestLine._M_string_length;
  std::__cxx11::string::_M_construct<char*>((string *)&local_48,pcVar1,pcVar1 + end_idx);
  psVar3 = local_48;
  iVar4 = std::__cxx11::string::find((char *)&local_48,0x12ab36);
  if (iVar4 < 0) {
    iVar5 = std::__cxx11::string::find((char *)&local_48,0x12ab3a);
    iVar4 = 5;
    if (iVar5 < 0) {
      iVar5 = std::__cxx11::string::find((char *)&local_48,0x12ab3f);
      SVar7 = BadRequest;
      if (iVar5 < 0) goto LAB_00120bf1;
      MVar2 = Post;
    }
    else {
      MVar2 = Head;
    }
  }
  else {
    iVar4 = 4;
    MVar2 = Get;
  }
  this->method_ = MVar2;
  this->checked_idx_ = iVar4 + this->checked_idx_;
  uVar6 = std::__cxx11::string::find((char)&local_48,0x20);
  SVar7 = BadRequest;
  if (-1 < (int)uVar6) {
    std::__cxx11::string::assign<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,void>
              ((string *)&this->path_,(char *)((long)this->checked_idx_ + (long)psVar3),
               (char *)((ulong)(uVar6 & 0x7fffffff) + (long)psVar3));
    this->checked_idx_ = uVar6 + 1;
    if ((long)requestLine._M_dataplus._M_p - (ulong)(uVar6 + 1) == 8) {
      std::__cxx11::string::find((char *)&local_48,0x12ab44);
      if ((((undefined1 *)((long)local_48 + -1))[(long)requestLine._M_dataplus._M_p] & 0xfe) == 0x30
         ) {
        this->version_ = Http11;
        this->checked_idx_ = (int)requestLine._M_dataplus._M_p + 2;
        SVar7 = OK;
      }
    }
  }
LAB_00120bf1:
  std::__cxx11::string::~string((string *)&local_48);
  return SVar7;
}

Assistant:

HttpConn::StatusCode HttpConn::parseRequesetLine(int end_idx) {
    std::string requestLine(readBuff_.data(), readBuff_.data() + end_idx);
    auto beg = requestLine.begin();
    int pos;
    do {
        pos = requestLine.find("GET");
        if (pos >= 0) {
            method_ = Get;
            checked_idx_ += 4;
            break;
        }
        pos = requestLine.find("HEAD");
        if (pos >= 0) {
            method_ = Head;
            checked_idx_ += 5;
            break;
        }
        pos = requestLine.find("POST");
        if (pos >= 0) {
            method_ = Post;
            checked_idx_ += 5;
            break;
        }
        //加入其他方法
        return BadRequest;
    } while (false);
    
    pos = requestLine.find(' ', checked_idx_);
    if (pos < 0) {
        return BadRequest;
    } else {
        path_.assign(beg + checked_idx_, beg + pos);
        checked_idx_ = pos + 1;
    }
   
    if ((requestLine.size() - checked_idx_) != 8 || requestLine.find("HTTP/1.", checked_idx_) < 0) {
        return BadRequest;
    } else if (requestLine.back() == '1') {
        version_ = Http11;
    } else if (requestLine.back() == '0') {
        version_ = Http11;
    } else 
        return BadRequest;
    
    checked_idx_ = requestLine.size() + 2;
    return OK;
}